

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O1

BVSparse<Memory::JitArenaAllocator> * __thiscall
BVSparse<Memory::JitArenaAllocator>::AndNew
          (BVSparse<Memory::JitArenaAllocator> *this,BVSparse<Memory::JitArenaAllocator> *bv,
          JitArenaAllocator *allocator)

{
  BVSparse<Memory::JitArenaAllocator> *this_00;
  
  this_00 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,allocator,0x3f1274);
  this_00->head = (Type_conflict)0x0;
  this_00->lastFoundIndex = (Type_conflict)0x0;
  this_00->alloc = allocator;
  this_00->lastUsedNodePrevNextField = (Type)this_00;
  for_each<&BVUnitT<unsigned_long>::And>(this_00,this,bv);
  return this_00;
}

Assistant:

BVSparse<TAllocator> *
BVSparse<TAllocator>::AndNew(const BVSparse* bv, TAllocator* allocator) const
{
    BVSparse * newBv = AllocatorNew(TAllocator, allocator, BVSparse, allocator);
    newBv->for_each<&SparseBVUnit::And>(this, bv);
    return newBv;
}